

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMesh::ComputeMassProperties
          (ChMesh *this,double *mass,ChVector<double> *com,ChMatrix33<double> *inertia)

{
  double dVar1;
  bool bVar2;
  pointer psVar3;
  pointer psVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  *mass = 0.0;
  com->m_data[2] = 0.0;
  com->m_data[0] = 0.0;
  com->m_data[1] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  psVar4 = (this->vnodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->vnodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4;
  if (lVar5 != 0) {
    uVar6 = 1;
    do {
      ((psVar4->super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
      ->m_TotalMass = 0.0;
      psVar4 = psVar4 + 1;
      bVar2 = uVar6 < (ulong)(lVar5 >> 4);
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  psVar3 = (this->velements).
           super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->velements).
      super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    uVar6 = 0;
    uVar8 = 1;
    do {
      (*(psVar3[uVar6].super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_ChElementBase[8])();
      psVar3 = (this->velements).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar8 < (ulong)((long)(this->velements).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4);
      uVar6 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar2);
  }
  psVar4 = (this->vnodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->vnodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4;
  if (lVar5 != 0) {
    dVar1 = *mass;
    uVar7 = 1;
    do {
      dVar1 = dVar1 + ((psVar4->
                       super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_TotalMass;
      *mass = dVar1;
      uVar6 = (ulong)uVar7;
      psVar4 = psVar4 + 1;
      uVar7 = uVar7 + 1;
    } while (uVar6 < (ulong)(lVar5 >> 4));
  }
  return;
}

Assistant:

void ChMesh::ComputeMassProperties(double& mass,           // ChMesh object mass
                                   ChVector<>& com,        // ChMesh center of gravity
                                   ChMatrix33<>& inertia)  // ChMesh inertia tensor
{
    mass = 0;
    com = ChVector<>(0);
    inertia = ChMatrix33<>(1);

    // Initialize all nodal total masses to zero
    for (unsigned int j = 0; j < vnodes.size(); j++) {
        vnodes[j]->m_TotalMass = 0.0;
    }
    // Loop over all elements and calculate contribution to nodal mass
    for (unsigned int ie = 0; ie < velements.size(); ie++) {
        velements[ie]->ComputeNodalMass();
    }
    // Loop over all the nodes of the mesh to obtain total object mass
    for (unsigned int j = 0; j < vnodes.size(); j++) {
        mass += vnodes[j]->m_TotalMass;
    }
}